

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_prepare_base_deletion_sync
               (tsd_t *tsd,malloc_mutex_t *mtx,malloc_mutex_t **delayed_mtx,uint *n_delayed)

{
  _Bool _Var1;
  uint uVar2;
  
  _Var1 = malloc_mutex_trylock((tsdn_t *)tsd,mtx);
  if (_Var1) {
    uVar2 = *n_delayed + 1;
    delayed_mtx[*n_delayed] = mtx;
    if (uVar2 == 0x20) {
      arena_prepare_base_deletion_sync_finish(tsd,delayed_mtx,0x20);
      uVar2 = 0;
    }
    *n_delayed = uVar2;
    return;
  }
  (mtx->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&mtx->field_0 + 0x48));
  return;
}

Assistant:

static void
arena_prepare_base_deletion_sync(tsd_t *tsd, malloc_mutex_t *mtx,
    malloc_mutex_t **delayed_mtx, unsigned *n_delayed) {
	if (!malloc_mutex_trylock(tsd_tsdn(tsd), mtx)) {
		/* No contention. */
		malloc_mutex_unlock(tsd_tsdn(tsd), mtx);
		return;
	}
	unsigned n = *n_delayed;
	assert(n < ARENA_DESTROY_MAX_DELAYED_MTX);
	/* Add another to the batch. */
	delayed_mtx[n++] = mtx;

	if (n == ARENA_DESTROY_MAX_DELAYED_MTX) {
		arena_prepare_base_deletion_sync_finish(tsd, delayed_mtx, n);
		n = 0;
	}
	*n_delayed = n;
}